

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isBooleanConvertible(Type *this)

{
  bool bVar1;
  uint uVar2;
  Type *pTVar3;
  
  pTVar3 = getCanonicalType(this);
  uVar2 = (pTVar3->super_Symbol).kind - ClassType;
  if ((uVar2 < 0xd) && ((0x107bU >> (uVar2 & 0x1f) & 1) != 0)) {
    return true;
  }
  bVar1 = isNumeric(this);
  return bVar1;
}

Assistant:

bool Type::isBooleanConvertible() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::NullType:
        case SymbolKind::CHandleType:
        case SymbolKind::StringType:
        case SymbolKind::EventType:
        case SymbolKind::ClassType:
        case SymbolKind::CovergroupType:
        case SymbolKind::VirtualInterfaceType:
            return true;
        default:
            return isNumeric();
    }
}